

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_timeout.cc
# Opt level: O0

int64_t __thiscall
absl::lts_20240722::synchronization_internal::KernelTimeout::MakeAbsNanos(KernelTimeout *this)

{
  KernelTimeout *pKVar1;
  bool bVar2;
  int64_t iVar3;
  long *plVar4;
  long lVar5;
  int64_t now;
  long local_28;
  KernelTimeout *local_20;
  int64_t nanos;
  KernelTimeout *this_local;
  
  nanos = (int64_t)this;
  bVar2 = has_timeout(this);
  if (bVar2) {
    local_20 = (KernelTimeout *)RawAbsNanos(this);
    bVar2 = is_relative_timeout(this);
    pKVar1 = local_20;
    if (bVar2) {
      iVar3 = SteadyClockNow();
      local_28 = (long)pKVar1 - iVar3;
      now = 0;
      plVar4 = std::max<long>(&local_28,&now);
      local_20 = (KernelTimeout *)*plVar4;
      lVar5 = absl::lts_20240722::GetCurrentTimeNanos();
      if (0x7fffffffffffffff - lVar5 < (long)local_20) {
        local_20 = (KernelTimeout *)0x7fffffffffffffff;
      }
      else {
        local_20 = (KernelTimeout *)(lVar5 + (long)local_20);
      }
    }
    else if (local_20 == (KernelTimeout *)0x0) {
      local_20 = (KernelTimeout *)0x1;
    }
    this_local = local_20;
  }
  else {
    this_local = (KernelTimeout *)0x7fffffffffffffff;
  }
  return (int64_t)this_local;
}

Assistant:

int64_t KernelTimeout::MakeAbsNanos() const {
  if (!has_timeout()) {
    return kMaxNanos;
  }

  int64_t nanos = RawAbsNanos();

  if (is_relative_timeout()) {
    // We need to change epochs, because the relative timeout might be
    // represented by an absolute timestamp from another clock.
    nanos = std::max<int64_t>(nanos - SteadyClockNow(), 0);
    int64_t now = absl::GetCurrentTimeNanos();
    if (nanos > kMaxNanos - now) {
      // Overflow.
      nanos = kMaxNanos;
    } else {
      nanos += now;
    }
  } else if (nanos == 0) {
    // Some callers have assumed that 0 means no timeout, so instead we return a
    // time of 1 nanosecond after the epoch.
    nanos = 1;
  }

  return nanos;
}